

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmltosmf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  runtime_error *this;
  long *plVar5;
  path path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fileImage;
  string input;
  Smf smf;
  string mml;
  string output;
  options_description desc;
  positional_options_description pd;
  fstream fs;
  variables_map vm;
  basic_parsed_options<char> local_460;
  runtime_error *local_438;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  Smf local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  long *local_398 [2];
  long local_388 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_370 [24];
  void *local_358;
  undefined4 local_350;
  undefined8 local_348;
  undefined4 local_340;
  long local_338;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_330 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  long *local_300;
  long local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [32];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2b0 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_290 [32];
  options_description *local_270;
  undefined8 auStack_1f8 [37];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_string_length = 0;
  local_418.field_2._M_local_buf[0] = '\0';
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_local_buf[0] = '\0';
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  local_2e0._0_8_ = (pointer)local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_398,(string *)local_2e0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_2e0._0_8_ != (pointer)local_2d0) {
    operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._0_8_ + 1));
  }
  local_2e0._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_2e0,"version");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar1,"help");
  ptVar2 = boost::program_options::value<std::__cxx11::string>(&local_418);
  ptVar2->m_required = true;
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"input,i",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>(&local_3b8);
  ptVar2->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"output,o",(char *)ptVar2);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_318);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_2e0,argc,argv);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_2e0)
  ;
  local_270 = (options_description *)local_398;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_2e0);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_460,(basic_command_line_parser<char> *)local_2e0);
  boost::program_options::store((basic_parsed_options *)&local_460,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_460.options);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_290);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2e0);
  local_2e0._0_8_ = (pointer)local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"version","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_2e0);
  if ((pointer)local_2e0._0_8_ != (pointer)local_2d0) {
    operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._0_8_ + 1));
  }
  if (cVar3._M_node == &local_b8) {
    local_2e0._0_8_ = (pointer)local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"help","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_2e0);
    if ((pointer)local_2e0._0_8_ != (pointer)local_2d0) {
      operator_delete((void *)local_2e0._0_8_,(ulong)(local_2d0._0_8_ + 1));
    }
    if (cVar4._M_node == cVar3._M_node) {
      boost::program_options::notify((variables_map *)local_d0);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&local_460,&local_418,auto_format);
      std::fstream::fstream
                (local_2e0,
                 (char *)local_460.options.
                         super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,_S_in|_S_bin);
      if (((byte)local_2b0[*(size_type *)(local_2e0._0_8_ + -0x18) - 0x10] & 5) != 0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"input file open error.");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_3d8,
                 *(undefined8 *)((long)auStack_1f8 + *(size_type *)(local_2e0._0_8_ + -0x18)),
                 0xffffffff,0,0xffffffff);
      std::fstream::~fstream(local_2e0);
      std::filesystem::__cxx11::path::~path((path *)&local_460);
      rlib::sequencer::mmlToSmf(&local_3f8,&local_3d8);
      rlib::midi::Smf::getFileImage(&local_430,&local_3f8);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&local_460,&local_3b8,auto_format);
      std::fstream::fstream
                (local_2e0,
                 (char *)local_460.options.
                         super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,_S_trunc|_S_out|_S_bin);
      if (((byte)local_2b0[*(size_type *)(local_2e0._0_8_ + -0x18) - 0x10] & 5) != 0) {
        local_438 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(local_438,"output file open error.");
        __cxa_throw(local_438,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::ostream::write(local_2d0,
                          (long)local_430.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::fstream::~fstream(local_2e0);
      std::filesystem::__cxx11::path::~path((path *)&local_460);
      if (local_430.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_430.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_430.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_430.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::__cxx11::_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_clear(&local_3f8.tracks.
                super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0010d520;
    }
    plVar5 = (long *)boost::program_options::operator<<
                               ((ostream *)&std::cout,(options_description *)local_398);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  }
  else {
    plVar5 = &std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"mmltosmf version 1.2.3",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  }
  std::ostream::put((char)plVar5);
  std::ostream::flush();
LAB_0010d520:
  local_d0[0] = std::logic_error::logic_error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(local_c0);
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_330);
  if (local_358 != (void *)0x0) {
    operator_delete(local_358,local_338 - (long)local_358);
    local_358 = (void *)0x0;
    local_350 = 0;
    local_348 = 0;
    local_340 = 0;
    local_338 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_370);
  if (local_398[0] != local_388) {
    operator_delete(local_398[0],local_388[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT71(local_3b8.field_2._M_allocated_capacity._1_7_,
                             local_3b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,
                    CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                             local_418.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(const int argc, const char* const argv[])
{
	namespace po = boost::program_options;

	try {
		std::string input, output;
		po::options_description desc("options");
		desc.add_options()
			("version", "show version")
			("help", "show help")
			("input,i", po::value(&input)->required(), "input file (required)")		// 入力ファイルパス(mml)
			("output,o", po::value(&output)->required(), "output file (required)")	// 出力ファイル(mid)
			;

		po::positional_options_description pd;
		// pd.add("input", -1);

		po::variables_map vm;
		po::store(po::command_line_parser(argc, argv).options(desc).positional(pd).run(), vm);

		if (vm.count("version")) {
			std::cout << "mmltosmf version 1.2.3" << std::endl;
			return 0;
		}

		if (vm.count("help")) {
			std::cout << desc << std::endl;		// ヘルプ表示
			return 0;
		}

		po::notify(vm);

		const std::string mml = [&] {
			auto path = std::filesystem::u8path(input);
			std::fstream fs(path, std::ios::in | std::ios::binary);
			if (fs.fail()) {
				throw std::runtime_error("input file open error.");
			}
			const std::istreambuf_iterator<char> begin(fs);
			return std::string(begin, std::istreambuf_iterator<char>());
		}();

		try {
			const midi::Smf smf = sequencer::mmlToSmf(mml);
			auto fileImage = smf.getFileImage();

			auto path = std::filesystem::u8path(output);
			std::fstream fs(path, std::ios::out | std::ios::binary | std::ios::trunc);
			if (fs.fail()) {
				throw std::runtime_error("output file open error.");
			}
			fs.write(reinterpret_cast<const char* const>(fileImage.data()), fileImage.size());

		} catch (const sequencer::MmlCompiler::Exception& e) {

			const size_t lineNumber = [&] {	// 行番号取得
				static const std::regex re(R"(\r\n|\n|\r)");
				size_t lf = 0;
				for (auto i = std::sregex_token_iterator(mml.cbegin(), e.it, re, -1); i != std::sregex_token_iterator(); i++) lf++;
				return lf;
			}();
			const auto msg = sequencer::MmlCompiler::Exception::getMessage(e.code);	// エラーメッセージ取得
			auto errorWord = [&] {
				std::string s(e.errorWord);
				std::smatch m;
				if (std::regex_search(s, m, std::regex(R"(\r\n|\n|\r)"))) {
					s = std::string(s.cbegin(), m[0].first);
				}
				return s;
			}();

			const auto s = string::format(R"(line %d %s : %s)", lineNumber, errorWord, msg);
			throw std::runtime_error(s);
		}

	} catch (std::exception& e) {
		std::cerr << e.what() << std::endl;
		return 1;
	}

	return 0;
}